

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManPrintObjects(Gli_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = 0;
  while (((int)uVar4 < p->nObjData && (p->pObjData != (int *)0x0))) {
    puVar1 = (uint *)(p->pObjData + uVar4);
    printf("Node %d \n",(ulong)puVar1[1]);
    printf("Fanins: ");
    for (uVar3 = 0; uVar3 < (*puVar1 >> 4 & 7); uVar3 = uVar3 + 1) {
      printf("%d ",(ulong)puVar1[1 - (long)(int)puVar1[uVar3 + 7]]);
    }
    putchar(10);
    uVar2 = 0;
    printf("Fanouts: ");
    while( true ) {
      if (*puVar1 >> 7 <= uVar2) break;
      printf("%d ",(ulong)puVar1[(long)(int)puVar1[(ulong)((*puVar1 >> 4 & 7) + uVar2) + 7] + 1]);
      uVar2 = uVar2 + 1;
    }
    putchar(10);
    uVar4 = uVar4 + (*puVar1 >> 7) + (*puVar1 >> 4 & 7) + 8;
  }
  return;
}

Assistant:

void Gli_ManPrintObjects( Gli_Man_t * p )
{
    Gli_Obj_t * pObj, * pNext;
    int i, k;
    Gli_ManForEachObj( p, pObj, i )
    {
        printf( "Node %d \n", pObj->Handle );
        printf( "Fanins: " );
        Gli_ObjForEachFanin( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
        printf( "Fanouts: " );
        Gli_ObjForEachFanout( pObj, pNext, k )
            printf( "%d ", pNext->Handle );
        printf( "\n" );
    }
}